

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::GetPowerStatus(AmpIO *this,uint index)

{
  uint uVar1;
  uint32_t uVar2;
  byte bVar3;
  
  uVar1 = this->ReadBuffer[1];
  bVar3 = (byte)(uVar1 >> 0x13);
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x44514c41) {
    if ((index & 3) != 0) {
      bVar3 = ((index & 3) << 0xe & ~uVar1) == 0;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool AmpIO::GetPowerStatus(unsigned int index) const
{
    // Bit 19: MV_GOOD
    uint32_t status = GetStatus();
    bool ret = status & MV_GOOD_BIT;
    if (GetHardwareVersion() == DQLA_String) {
        uint32_t mask = 0;
        if (index&1) mask |= DQLA_MV_GOOD_1;
        if (index&2) mask |= DQLA_MV_GOOD_2;
        if (mask != 0)
            ret = ((status & mask) == mask);
    }
    return ret;
}